

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Skeleton::save(Skeleton *this,char *filename)

{
  XMLError XVar1;
  ostream *poVar2;
  XMLElement *parentNode;
  XMLError eResult;
  XMLElement *pRoot;
  XMLDocument xmlDoc;
  char *filename_local;
  Skeleton *this_local;
  
  xmlDoc._commentPool._120_8_ = filename;
  poVar2 = std::operator<<((ostream *)&std::cerr,"Writing skeleton to file ");
  poVar2 = std::operator<<(poVar2,(char *)xmlDoc._commentPool._120_8_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tinyxml2::XMLDocument::XMLDocument((XMLDocument *)&pRoot,true,PRESERVE_WHITESPACE);
  parentNode = tinyxml2::XMLDocument::NewElement((XMLDocument *)&pRoot,"Skeleton");
  tinyxml2::XMLNode::InsertFirstChild((XMLNode *)&pRoot,&parentNode->super_XMLNode);
  saveJoint(this,(XMLDocument *)&pRoot,parentNode,this->root);
  XVar1 = tinyxml2::XMLDocument::SaveFile
                    ((XMLDocument *)&pRoot,(char *)xmlDoc._commentPool._120_8_,false);
  if (XVar1 != XML_NO_ERROR) {
    printf("Error: %i\n",(ulong)XVar1);
  }
  tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)&pRoot);
  return;
}

Assistant:

void Skeleton::save(const char * filename)
   {
     cerr << "Writing skeleton to file " << filename << endl;
     XMLDocument xmlDoc;
     XMLElement* pRoot = xmlDoc.NewElement("Skeleton");
     xmlDoc.InsertFirstChild(pRoot);

     saveJoint(&xmlDoc, pRoot, root);

     XMLError eResult = xmlDoc.SaveFile(filename);
     XMLCheckResult(eResult);
   }